

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

shared_ptr<evp_pkey_st> __thiscall
jwt::helper::load_public_key_from_string(helper *this,string *key,string *password)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BIO_METHOD *type;
  EVP_PKEY *__p;
  rsa_exception *prVar4;
  ulong e;
  char *__s;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<evp_pkey_st> sVar5;
  allocator<char> local_79;
  unique_ptr<bio_st,_void_(*)(bio_st_*)> pubkey_bio;
  string epkey;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  type = BIO_s_mem();
  pubkey_bio._M_t.super___uniq_ptr_impl<bio_st,_void_(*)(bio_st_*)>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_void_(*)(bio_st_*)>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (bio_st *)BIO_new(type);
  pubkey_bio._M_t.super___uniq_ptr_impl<bio_st,_void_(*)(bio_st_*)>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_void_(*)(bio_st_*)>.super__Tuple_impl<1UL,_void_(*)(bio_st_*)>.
  super__Head_base<1UL,_void_(*)(bio_st_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(bio_st_*),_false>)BIO_free_all;
  std::__cxx11::string::substr((ulong)&epkey,(ulong)key);
  bVar1 = std::operator==(&epkey,"-----BEGIN CERTIFICATE-----");
  std::__cxx11::string::~string((string *)&epkey);
  if (bVar1) {
    extract_pubkey_from_cert(&epkey,key,password);
    iVar2 = BIO_write((BIO *)pubkey_bio._M_t.super___uniq_ptr_impl<bio_st,_void_(*)(bio_st_*)>._M_t.
                             super__Tuple_impl<0UL,_bio_st_*,_void_(*)(bio_st_*)>.
                             super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                      epkey._M_dataplus._M_p,(int)epkey._M_string_length);
    if (iVar2 != (int)epkey._M_string_length) {
      prVar4 = (rsa_exception *)__cxa_allocate_exception(0x10);
      rsa_exception::rsa_exception(prVar4,"failed to load public key: bio_write failed");
      __cxa_throw(prVar4,&rsa_exception::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::~string((string *)&epkey);
  }
  else {
    iVar2 = (int)key->_M_string_length;
    iVar3 = BIO_write((BIO *)pubkey_bio._M_t.super___uniq_ptr_impl<bio_st,_void_(*)(bio_st_*)>._M_t.
                             super__Tuple_impl<0UL,_bio_st_*,_void_(*)(bio_st_*)>.
                             super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                      (key->_M_dataplus)._M_p,iVar2);
    if (iVar3 != iVar2) {
      prVar4 = (rsa_exception *)__cxa_allocate_exception(0x10);
      rsa_exception::rsa_exception(prVar4,"failed to load public key: bio_write failed");
      __cxa_throw(prVar4,&rsa_exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __p = PEM_read_bio_PUBKEY((BIO *)pubkey_bio._M_t.super___uniq_ptr_impl<bio_st,_void_(*)(bio_st_*)>
                                   ._M_t.super__Tuple_impl<0UL,_bio_st_*,_void_(*)(bio_st_*)>.
                                   super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                            (EVP_PKEY **)0x0,(undefined1 *)0x0,(password->_M_dataplus)._M_p);
  std::__shared_ptr<evp_pkey_st,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<evp_pkey_st,void(*)(evp_pkey_st*),void>
            ((__shared_ptr<evp_pkey_st,(__gnu_cxx::_Lock_policy)2> *)this,(evp_pkey_st *)__p,
             EVP_PKEY_free);
  if (*(long *)this != 0) {
    std::unique_ptr<bio_st,_void_(*)(bio_st_*)>::~unique_ptr(&pubkey_bio);
    sVar5.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar5.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<evp_pkey_st>)
           sVar5.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>;
  }
  prVar4 = (rsa_exception *)__cxa_allocate_exception(0x10);
  e = ERR_get_error();
  __s = ERR_error_string(e,(char *)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_79);
  std::operator+(&epkey,"failed to load public key: PEM_read_bio_PUBKEY failed:",&local_48);
  rsa_exception::rsa_exception(prVar4,&epkey);
  __cxa_throw(prVar4,&rsa_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
		std::shared_ptr<EVP_PKEY> load_public_key_from_string(const std::string& key, const std::string& password = "") {
			std::unique_ptr<BIO, decltype(&BIO_free_all)> pubkey_bio(BIO_new(BIO_s_mem()), BIO_free_all);
			if(key.substr(0, 27) == "-----BEGIN CERTIFICATE-----") {
				auto epkey = helper::extract_pubkey_from_cert(key, password);
				const int len = static_cast<int>(epkey.size());
				if (BIO_write(pubkey_bio.get(), epkey.data(), len) != len)
					throw rsa_exception("failed to load public key: bio_write failed");
			} else {
				const int len = static_cast<int>(key.size());
				if (BIO_write(pubkey_bio.get(), key.data(), len) != len)
					throw rsa_exception("failed to load public key: bio_write failed");
			}
			
			std::shared_ptr<EVP_PKEY> pkey(PEM_read_bio_PUBKEY(pubkey_bio.get(), nullptr, nullptr, (void*)password.c_str()), EVP_PKEY_free);
			if (!pkey)
				throw rsa_exception("failed to load public key: PEM_read_bio_PUBKEY failed:" + std::string(ERR_error_string(ERR_get_error(), NULL)));
			return pkey;
		}